

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

void ctemplate::EmitMissingInclude
               (char *filename,ExpandEmitter *output_buffer,PerExpandData *per_expand_data)

{
  TemplateAnnotator *pTVar1;
  size_t sVar2;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (per_expand_data->annotate_path_ != (char *)0x0) {
    pTVar1 = PerExpandData::annotator(per_expand_data);
    std::__cxx11::string::string((string *)local_40,filename,&local_41);
    (*pTVar1->_vptr_TemplateAnnotator[10])(pTVar1,output_buffer,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to load included template: \"",0x23);
  if (filename == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x150388);
  }
  else {
    sVar2 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"\n",2);
  return;
}

Assistant:

static void EmitMissingInclude(const char* const filename,
                               ExpandEmitter *output_buffer,
                               PerExpandData *per_expand_data) {
  // if there was a problem retrieving the template, bail!
  if (per_expand_data->annotate()) {
    TemplateAnnotator* annotator = per_expand_data->annotator();
    annotator->EmitFileIsMissing(output_buffer, filename);
  }
  LOG(ERROR) << "Failed to load included template: \"" << filename << "\"\n";
}